

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall
capnp::anon_unknown_79::Parser::unescapeAndAppend
          (Parser *this,ArrayPtr<const_char> hex,Vector<char> *target)

{
  undefined8 this_00;
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  ArrayPtr<char16_t> local_d8;
  ArrayPtr<const_char16_t> local_c8;
  EncodingResult<kj::String> local_b8;
  char16_t local_96;
  uint local_94;
  char16_t u;
  Fault f_1;
  char16_t cStack_80;
  char c;
  int i;
  int codePoint;
  Fault local_70;
  Fault f;
  size_t local_60;
  DebugExpression<unsigned_long> local_58;
  undefined1 local_50 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  Vector<char> *target_local;
  Parser *this_local;
  ArrayPtr<const_char> hex_local;
  
  hex_local.ptr = (char *)hex.size_;
  this_local = (Parser *)hex.ptr;
  _kjCondition._32_8_ = target;
  local_60 = kj::ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&this_local);
  local_58 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_60);
  f.exception._4_4_ = 4;
  kj::_::DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_int> *)local_50,&local_58,
             (int *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
              (&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x345,FAILED,"hex.size() == 4","_kjCondition,",
               (DebugComparison<unsigned_long,_int> *)local_50);
    kj::_::Debug::Fault::fatal(&local_70);
  }
  _cStack_80 = 0;
  f_1.exception._4_4_ = 0;
  do {
    this_00 = _kjCondition._32_8_;
    if (3 < f_1.exception._4_4_) {
      if ((int)_cStack_80 < 0x80) {
        local_94 = (int)(char)_cStack_80 & 0x7f;
        kj::Vector<char>::add<int>((Vector<char> *)_kjCondition._32_8_,(int *)&local_94);
      }
      else {
        local_96 = cStack_80;
        local_d8 = kj::arrayPtr<char16_t>(&local_96,1);
        local_c8 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_d8);
        kj::decodeUtf16(&local_b8,local_c8);
        kj::Vector<char>::addAll<kj::EncodingResult<kj::String>>((Vector<char> *)this_00,&local_b8);
        kj::EncodingResult<kj::String>::~EncodingResult(&local_b8);
      }
      return;
    }
    pcVar3 = kj::ArrayPtr<const_char>::operator[]
                       ((ArrayPtr<const_char> *)&this_local,(long)f_1.exception._4_4_);
    f_1.exception._3_1_ = *pcVar3;
    if ((f_1.exception._3_1_ < '0') || ('9' < f_1.exception._3_1_)) {
      if ((f_1.exception._3_1_ < 'a') || ('f' < f_1.exception._3_1_)) {
        if ((f_1.exception._3_1_ < 'A') || ('F' < f_1.exception._3_1_)) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37],char&>
                    ((Fault *)&stack0xffffffffffffff70,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                     ,0x353,FAILED,(char *)0x0,"\"Invalid hex digit in unicode escape.\", c",
                     (char (*) [37])"Invalid hex digit in unicode escape.",
                     (char *)((long)&f_1.exception + 3));
          kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff70);
        }
        uVar2 = (int)f_1.exception._3_1_ - 0x37;
      }
      else {
        uVar2 = (int)f_1.exception._3_1_ - 0x57;
      }
    }
    else {
      uVar2 = (int)f_1.exception._3_1_ - 0x30;
    }
    _cStack_80 = uVar2 | _cStack_80 << 4;
    f_1.exception._4_4_ = f_1.exception._4_4_ + 1;
  } while( true );
}

Assistant:

void unescapeAndAppend(kj::ArrayPtr<const char> hex, kj::Vector<char>& target) {
    KJ_REQUIRE(hex.size() == 4);
    int codePoint = 0;

    for (int i = 0; i < 4; ++i) {
      char c = hex[i];
      codePoint <<= 4;

      if ('0' <= c && c <= '9') {
        codePoint |= c - '0';
      } else if ('a' <= c && c <= 'f') {
        codePoint |= c - 'a' + 10;
      } else if ('A' <= c && c <= 'F') {
        codePoint |= c - 'A' + 10;
      } else {
        KJ_FAIL_REQUIRE("Invalid hex digit in unicode escape.", c);
      }
    }

    if (codePoint < 128) {
      target.add(0x7f & static_cast<char>(codePoint));
    } else {
      // TODO(perf): This is sorta malloc-heavy...
      char16_t u = codePoint;
      target.addAll(kj::decodeUtf16(kj::arrayPtr(&u, 1)));
    }
  }